

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O2

size_t beast::detail::base64::encode<void>(void *dest,void *src,size_t len)

{
  ulong uVar1;
  char *pcVar2;
  char *out;
  bool bVar3;
  
  uVar1 = len / 3;
  pcVar2 = (char *)dest;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    *pcVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
    pcVar2[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uint)(*(byte *)((long)src + 1) >> 4) | (*src & 3) << 4];
    pcVar2[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uint)(*(byte *)((long)src + 2) >> 6) + (*(byte *)((long)src + 1) & 0xf) * 4];
    pcVar2[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [*(byte *)((long)src + 2) & 0x3f];
    pcVar2 = pcVar2 + 4;
    src = (void *)((long)src + 3);
  }
  if (len % 3 == 1) {
    *pcVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
    pcVar2[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(*src & 3) << 4];
    pcVar2[2] = '=';
  }
  else {
    if (len % 3 != 2) goto LAB_001bfe89;
    *pcVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
    pcVar2[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uint)(*(byte *)((long)src + 1) >> 4) | (*src & 3) << 4];
    pcVar2[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(ulong)(*(byte *)((long)src + 1) & 0xf) * 4];
  }
  pcVar2[3] = '=';
  pcVar2 = pcVar2 + 4;
LAB_001bfe89:
  return (long)pcVar2 - (long)dest;
}

Assistant:

std::size_t
encode(void* dest, void const* src, std::size_t len)
{
    char*      out = static_cast<char*>(dest);
    char const* in = static_cast<char const*>(src);
    auto const tab = base64::get_alphabet();

    for(auto n = len / 3; n--;)
    {
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4) + ((in[1] & 0xf0) >> 4)];
        *out++ = tab[((in[2] & 0xc0) >> 6) + ((in[1] & 0x0f) << 2)];
        *out++ = tab[  in[2] & 0x3f];
        in += 3;
    }

    switch(len % 3)
    {
    case 2:
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4) + ((in[1] & 0xf0) >> 4)];
        *out++ = tab[                         (in[1] & 0x0f) << 2];
        *out++ = '=';
        break;

    case 1:
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4)];
        *out++ = '=';
        *out++ = '=';
        break;

    case 0:
        break;
    }

    return out - static_cast<char*>(dest);
}